

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

void __thiscall
FOOLElimination::collectSorts
          (FOOLElimination *this,VList *vars,TermStack *typeVars,TermStack *termVars,
          TermStack *allVars,TermStack *termVarSorts)

{
  bool bVar1;
  TermList elem;
  size_t sVar2;
  Stack<Kernel::TermList> *in_RCX;
  List<unsigned_int> *in_RSI;
  TermStack *in_R8;
  uint i;
  TermList sort;
  uint var;
  Iterator fvi;
  Stack<Kernel::TermList> *in_stack_ffffffffffffff38;
  TermList in_stack_ffffffffffffff40;
  TermList in_stack_ffffffffffffff48;
  uint local_7c;
  TermList local_58;
  uint64_t local_50;
  TermList local_48;
  uint local_3c;
  Iterator local_38 [2];
  TermStack *pTVar3;
  
  Lib::List<unsigned_int>::Iterator::Iterator(local_38,in_RSI);
  while (bVar1 = Lib::List<unsigned_int>::Iterator::hasNext((Iterator *)0xb96b86), bVar1) {
    local_3c = Lib::List<unsigned_int>::Iterator::next
                         ((Iterator *)in_stack_ffffffffffffff40._content);
    local_50 = (uint64_t)Kernel::AtomicSort::defaultSort();
    local_48 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                         (in_stack_ffffffffffffff40._content,
                          (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff48
                         );
    local_58 = Kernel::AtomicSort::superSort();
    bVar1 = Kernel::TermList::operator==(&local_48,&local_58);
    if (bVar1) {
      Kernel::TermList::TermList
                ((TermList *)in_stack_ffffffffffffff40._content,
                 (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0));
      Lib::Stack<Kernel::TermList>::push(in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
      Kernel::TermList::TermList
                ((TermList *)in_stack_ffffffffffffff40._content,
                 (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0));
      Lib::Stack<Kernel::TermList>::push(in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
    }
    else {
      in_stack_ffffffffffffff48._content = (uint64_t)in_RCX;
      Lib::Stack<Kernel::TermList>::push(in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
      in_RCX = (Stack<Kernel::TermList> *)in_stack_ffffffffffffff48._content;
      Kernel::TermList::TermList
                ((TermList *)in_stack_ffffffffffffff40._content,
                 (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0));
      Lib::Stack<Kernel::TermList>::push(in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
    }
  }
  local_7c = 0;
  while( true ) {
    elem._content = (uint64_t)local_7c;
    sVar2 = Lib::Stack<Kernel::TermList>::size(in_RCX);
    if (sVar2 <= elem._content) break;
    pTVar3 = in_R8;
    Lib::Stack<Kernel::TermList>::operator[](in_RCX,(ulong)local_7c);
    Lib::Stack<Kernel::TermList>::push(in_R8,elem);
    local_7c = local_7c + 1;
    in_R8 = pTVar3;
  }
  Kernel::SortHelper::normaliseArgSorts(in_RCX,in_R8);
  return;
}

Assistant:

void FOOLElimination::collectSorts(VList* vars, TermStack& typeVars,
                                   TermStack& termVars, TermStack& allVars, TermStack& termVarSorts)
{
  VList::Iterator fvi(vars);
  while (fvi.hasNext()) {
    unsigned var = fvi.next();
    ASS_REP(_varSorts.find(var), var);
    TermList sort = _varSorts.get(var, AtomicSort::defaultSort());
    if(sort == AtomicSort::superSort()){
      //variable is a type var
      allVars.push(TermList(var, false));
      typeVars.push(TermList(var, false));
    } else {
      termVarSorts.push(sort);
      termVars.push(TermList(var, false));
    }   
  }
  
  for(unsigned i = 0; i < termVars.size(); i++){
    allVars.push(termVars[i]);
  }

  SortHelper::normaliseArgSorts(typeVars, termVarSorts);
}